

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O0

void __thiscall iDynTree::Traversal::~Traversal(Traversal *this)

{
  Traversal *in_RDI;
  vector<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_> *unaff_retaddr;
  uint in_stack_ffffffffffffffec;
  
  reset(in_RDI,in_stack_ffffffffffffffec);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>::~vector
            (unaff_retaddr);
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::~vector
            ((vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_> *)
             unaff_retaddr);
  std::vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>::~vector
            ((vector<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_> *)
             unaff_retaddr);
  return;
}

Assistant:

Traversal::~Traversal()
{
    reset(0);
}